

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void Fl_Shared_Image::add_handler(Fl_Shared_Handler f)

{
  Fl_Shared_Handler *pp_Var1;
  int iVar2;
  Fl_Shared_Handler *__dest;
  long lVar3;
  ulong uVar4;
  
  iVar2 = alloc_handlers_;
  if (0 < (long)num_handlers_) {
    lVar3 = 0;
    do {
      if (handlers_[lVar3] == f) {
        return;
      }
      lVar3 = lVar3 + 1;
    } while (num_handlers_ != lVar3);
  }
  lVar3 = (long)alloc_handlers_;
  if (alloc_handlers_ <= num_handlers_) {
    uVar4 = 0xffffffffffffffff;
    if (-0x21 < alloc_handlers_) {
      uVar4 = lVar3 * 8 + 0x100;
    }
    __dest = (Fl_Shared_Handler *)operator_new__(uVar4);
    pp_Var1 = handlers_;
    if ((iVar2 != 0) && (memcpy(__dest,handlers_,lVar3 << 3), pp_Var1 != (Fl_Shared_Handler *)0x0))
    {
      operator_delete__(pp_Var1);
    }
    alloc_handlers_ = alloc_handlers_ + 0x20;
    handlers_ = __dest;
  }
  handlers_[num_handlers_] = f;
  num_handlers_ = num_handlers_ + 1;
  return;
}

Assistant:

void Fl_Shared_Image::add_handler(Fl_Shared_Handler f) {
  int			i;		// Looping var...
  Fl_Shared_Handler	*temp;		// New image handler array...

  // First see if we have already added the handler...
  for (i = 0; i < num_handlers_; i ++) {
    if (handlers_[i] == f) return;
  }

  if (num_handlers_ >= alloc_handlers_) {
    // Allocate more memory...
    temp = new Fl_Shared_Handler [alloc_handlers_ + 32];

    if (alloc_handlers_) {
      memcpy(temp, handlers_, alloc_handlers_ * sizeof(Fl_Shared_Handler));

      delete[] handlers_;
    }

    handlers_       = temp;
    alloc_handlers_ += 32;
  }

  handlers_[num_handlers_] = f;
  num_handlers_ ++;
}